

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void nighttime(tgestate_t *state)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  searchlight_movement_t *slstate;
  
  if (state->searchlight_state == 0xff) {
    slstate = (state->searchlight).states;
    iVar5 = 3;
    goto LAB_001079b2;
  }
  if (state->room_index != '\0') {
    state->searchlight_state = 0xff;
    return;
  }
  if (state->searchlight_state == '\x1f') {
    bVar2 = (state->map_position).y;
    bVar6 = (state->map_position).x + 4;
    bVar1 = (state->searchlight).caught_coord.x;
    bVar3 = (state->searchlight).caught_coord.y;
    if (bVar1 == bVar6) {
      if (bVar3 == bVar2) {
        return;
      }
    }
    else if (bVar1 < bVar6) {
      bVar1 = bVar1 + 1;
    }
    else {
      bVar1 = bVar1 - 1;
    }
    if (bVar3 != bVar2) {
      if (bVar3 < bVar2) {
        bVar3 = bVar3 + 1;
      }
      else {
        bVar3 = bVar3 - 1;
      }
    }
    (state->searchlight).caught_coord.x = bVar1;
    (state->searchlight).caught_coord.y = bVar3;
  }
  bVar2 = (state->map_position).x;
  bVar1 = (state->map_position).y;
  slstate = (searchlight_movement_t *)&(state->searchlight).caught_coord;
  iVar5 = 1;
  do {
    iVar4 = (uint)(slstate->xy).x - (uint)bVar2;
    searchlight_plot(state,(state->speccy->screen).attributes +
                           (int)(((uint)(slstate->xy).y - (uint)bVar1) * state->width + iVar4 + 0x46
                                ),iVar4 >> 0x1f & 0xff);
    do {
      do {
        slstate = slstate + 1;
        iVar5 = iVar5 + -1;
        if (iVar5 == 0) {
          return;
        }
LAB_001079b2:
        searchlight_movement(slstate);
        searchlight_caught(state,slstate);
        bVar2 = (state->map_position).x;
        bVar1 = (slstate->xy).x;
      } while ((bVar1 + 0x10 < (uint)bVar2) ||
              ((int)((uint)bVar2 + state->columns) <= (int)(uint)bVar1));
      bVar1 = (state->map_position).y;
      bVar3 = (slstate->xy).y;
    } while ((bVar3 + 0x10 < (uint)bVar1) || ((int)((uint)bVar1 + state->rows) <= (int)(uint)bVar3))
    ;
  } while( true );
}

Assistant:

void nighttime(tgestate_t *state)
{
  uint8_t                 map_y;     /* was D */
  uint8_t                 map_x;     /* was E */
  uint8_t                 caught_y;  /* was H */
  uint8_t                 caught_x;  /* was L */
  int                     iters;     /* was B */
  attribute_t            *attrs;     /* was BC */
  searchlight_movement_t *slstate;   /* was HL */
  uint8_t                 clip_left; /* was A */
  int16_t                 column;    /* was BC */
  int16_t                 row;       /* was HL */

  assert(state != NULL);

  if (state->searchlight_state != searchlight_STATE_SEARCHING)
  {
    /* Caught. */

    if (state->room_index > room_0_OUTDOORS)
    {
      /* If the hero goes indoors then the searchlight loses track. */
      state->searchlight_state = searchlight_STATE_SEARCHING;
      return;
    }

    /* Otherwise the hero is outdoors. */

    /* If the searchlight previously caught the hero then track him. */

    if (state->searchlight_state == searchlight_STATE_CAUGHT)
    {
      map_x    = state->map_position.x + 4;
      map_y    = state->map_position.y;
      caught_x = state->searchlight.caught_coord.x; // Conv: Reordered
      caught_y = state->searchlight.caught_coord.y;

      if (caught_x == map_x)
      {
        /* If the highlight doesn't need to move then quit. */
        if (caught_y == map_y)
          return;
      }
      else
      {
        /* Move the searchlight left/right to focus on the hero. */
        if (caught_x < map_x)
          caught_x++;
        else
          caught_x--;
      }

      /* Move searchlight up/down to focus on the hero. */
      if (caught_y != map_y)
      {
        if (caught_y < map_y)
          caught_y++;
        else
          caught_y--;
      }

      state->searchlight.caught_coord.x = caught_x; // Conv: Fused store split apart.
      state->searchlight.caught_coord.y = caught_y;
    }

    map_x = state->map_position.x;
    map_y = state->map_position.y;
    /* This casts caught_coord into a searchlight_movement_t knowing that
     * only the coord members will be accessed. */
    slstate = (searchlight_movement_t *) &state->searchlight.caught_coord;
    iters = 1; // 1 iteration
    // PUSH BC
    // PUSH HL
    goto middle_bit;
  }

  /* When not tracking the hero all three searchlights are cycled through. */

  slstate = &state->searchlight.states[0];
  iters = 3; // 3 iterations == three searchlights
  do
  {
    searchlight_movement(slstate);
    searchlight_caught(state, slstate);

    map_x = state->map_position.x; // in E
    map_y = state->map_position.y; // in D

    /* Would the searchlight intersect with the game window? */
    // Conv: Reordered into the expected series
    // first check is if the searchlight image is off the left hand side
    // second check is if the searchlight image is off the right hand side
    // etc.
    if (slstate->xy.x + 16 < map_x || slstate->xy.x >= map_x + state->columns ||
        slstate->xy.y + 16 < map_y || slstate->xy.y >= map_y + state->rows)
      goto next;

middle_bit:
    clip_left = 0; // flag // the light is clipped to the left side of the window

    // HL points to slstate->xy OR -> state->searchlight.caught_coord depending on how it's entered

    column = slstate->xy.x - map_x;
    if (column < 0) // partly off the left hand side of the window
      clip_left = ~clip_left; // toggle flag 0 -> 255

    row = slstate->xy.y - map_y;

    // FUTURE: To avoid undefined behaviour (row & column _can_ be out of
    // bounds) pass the row and column into searchlight_plot.

    attrs = &state->speccy->screen.attributes[0x46 + row * state->width + column]; // 0x46 = address of top-left game window attribute

    // Conv: clip_left turned from state variable into function parameter.
    searchlight_plot(state, attrs, clip_left); // DE turned into HL from EX above

next:
    // POP HL
    // POP BC
    slstate++;
  }
  while (--iters);
}